

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O2

char * google::protobuf::internal::UTF8CoerceToStructurallyValid
                 (StringPiece *src_str,char *idst,char replace_char)

{
  char *__src;
  stringpiece_ssize_type sVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  StringPiece str2;
  StringPiece local_40;
  
  __src = src_str->ptr_;
  sVar1 = src_str->length_;
  iVar2 = UTF8SpnStructurallyValid(src_str);
  iVar5 = (int)sVar1;
  pcVar4 = __src;
  if (iVar2 != iVar5) {
    sVar6 = (size_t)iVar2;
    memmove(idst,__src,sVar6);
    pcVar7 = idst + sVar6;
    for (pcVar3 = __src + sVar6; pcVar4 = idst, pcVar3 < __src + iVar5; pcVar3 = pcVar3 + sVar6 + 1)
    {
      *pcVar7 = replace_char;
      pcVar4 = pcVar3 + 1;
      local_40.length_ = (long)(__src + iVar5) - (long)pcVar4;
      local_40.ptr_ = pcVar4;
      iVar2 = UTF8SpnStructurallyValid(&local_40);
      sVar6 = (size_t)iVar2;
      memmove(pcVar7 + 1,pcVar4,sVar6);
      pcVar7 = pcVar7 + sVar6 + 1;
    }
  }
  return pcVar4;
}

Assistant:

char* UTF8CoerceToStructurallyValid(const StringPiece& src_str,
                                    char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}